

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_inc(void)

{
  byte bVar1;
  _Bool r;
  bson_t b;
  char *json;
  bson_error_t error;
  undefined1 local_380 [232];
  char *local_298;
  undefined1 local_290 [8];
  undefined1 auStack_288 [640];
  
  local_298 = "{ \"$inc\" : { \"ref\" : 1 } }";
  bVar1 = bson_init_from_json(local_380,"{ \"$inc\" : { \"ref\" : 1 } }",0xffffffffffffffff,
                              local_290);
  if ((bVar1 & 1) != 0) {
    bson_destroy(local_380);
    return;
  }
  fprintf(_stderr,"%s\n",auStack_288);
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x920,"test_bson_json_inc","r");
  abort();
}

Assistant:

static void
test_bson_json_inc (void)
{
   /* test that reproduces a bug with special mode checking.  Specifically,
    * mistaking '$inc' for '$id'
    *
    * From https://github.com/mongodb/mongo-c-driver/issues/62
    */
   bson_error_t error;
   const char *json = "{ \"$inc\" : { \"ref\" : 1 } }";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   bson_destroy (&b);
}